

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil.cpp
# Opt level: O1

QString * QDBusUtil::argumentToString(QString *__return_storage_ptr__,QVariant *arg)

{
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  variantToString(arg,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QString argumentToString(const QVariant &arg)
    {
        QString out;

#ifndef QT_BOOTSTRAPPED
        variantToString(arg, out);
#else
        Q_UNUSED(arg);
#endif

        return out;
    }